

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O3

void __thiscall
Buffer_change_event_remove_string_Test::TestBody(Buffer_change_event_remove_string_Test *this)

{
  size_t sVar1;
  size_t sVar2;
  bfy_buffer *buf;
  char *message;
  initializer_list<bfy_changed_cb_info> __l;
  BufferWithReadonlyStrings local;
  allocator_type local_139;
  internal local_138 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> local_128;
  bfy_changed_cb_info local_110;
  string local_f8;
  BufferWithReadonlyStrings local_d8;
  
  anon_unknown.dwarf_1ffc5::BufferWithReadonlyStrings::BufferWithReadonlyStrings(&local_d8);
  sVar1 = bfy_buffer_get_content_len(&local_d8.buf);
  sVar2 = bfy_buffer_get_content_len(&local_d8.buf);
  bfy_buffer_set_changed_cb
            (&local_d8.buf,
             (anonymous_namespace)::BufferWithReadonlyStrings::start_listening_to_changes()::
             {lambda(auto:1*,auto:2_const*,void*)#1}::__invoke<bfy_buffer,bfy_changed_cb_info>,
             &local_d8.changes);
  (anonymous_namespace)::buffer_remove_string_abi_cxx11_
            (&local_f8,(_anonymous_namespace_ *)&local_d8,buf);
  local_110.n_deleted = sVar2 + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_110.n_added = 1;
  __l._M_len = 1;
  __l._M_array = &local_110;
  local_110.orig_size = sVar1;
  std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>::vector
            (&local_128,__l,&local_139);
  testing::internal::
  CmpHelperEQ<std::vector<bfy_changed_cb_info,std::allocator<bfy_changed_cb_info>>,std::vector<bfy_changed_cb_info,std::allocator<bfy_changed_cb_info>>>
            (local_138,"changes_t{expected}","local.changes",&local_128,&local_d8.changes);
  if (local_128.super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.
                    super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_128.
                          super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.
                          super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_138[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_128);
    if (local_130 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_130->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x63e,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_110);
    if (local_128.super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)((local_128.
                    super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>.
                    _M_impl.super__Vector_impl_data._M_start)->orig_size + 8))();
    }
  }
  if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,local_130);
  }
  anon_unknown.dwarf_1ffc5::BufferWithReadonlyStrings::~BufferWithReadonlyStrings(&local_d8);
  return;
}

Assistant:

TEST(Buffer, change_event_remove_string) {
    BufferWithReadonlyStrings local;
    auto const expected = bfy_changed_cb_info {
        .orig_size = bfy_buffer_get_content_len(&local.buf),
        .n_added = 1,
        .n_deleted = 1 + bfy_buffer_get_content_len(&local.buf)
    };

    local.start_listening_to_changes();
    buffer_remove_string(&local.buf);
    EXPECT_EQ(changes_t{expected}, local.changes);
}